

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

void __thiscall
ON_ParseSettings::SetContextAngleUnitSystem
          (ON_ParseSettings *this,AngleUnitSystem context_angle_unit_system)

{
  AngleUnitSystem AVar1;
  uint angle_unit_system_as_unsigned;
  AngleUnitSystem context_angle_unit_system_local;
  ON_ParseSettings *this_local;
  
  if ((((context_angle_unit_system == None) || (context_angle_unit_system == Unset)) ||
      (0xff < context_angle_unit_system)) ||
     (AVar1 = ON::AngleUnitSystemFromUnsigned((uint)context_angle_unit_system),
     context_angle_unit_system != AVar1)) {
    this->m_context_angle_unit_system = '\0';
  }
  else {
    this->m_context_angle_unit_system = context_angle_unit_system;
  }
  return;
}

Assistant:

void ON_ParseSettings::SetContextAngleUnitSystem(
  ON::AngleUnitSystem context_angle_unit_system
  )
{
  for (;;)
  {
    if (ON::AngleUnitSystem::None == context_angle_unit_system || ON::AngleUnitSystem::Unset == context_angle_unit_system)
      break;
    const unsigned int angle_unit_system_as_unsigned = static_cast<unsigned int>(context_angle_unit_system);
    if (angle_unit_system_as_unsigned > 0xFFU)
      break;
    if (context_angle_unit_system != ON::AngleUnitSystemFromUnsigned(angle_unit_system_as_unsigned))
      break;
    m_context_angle_unit_system = (ON__UINT8)angle_unit_system_as_unsigned;
    return;
  }
  m_context_angle_unit_system = 0; // radians
}